

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

EVevent_list copy_EVevent_list(EVevent_list list)

{
  void **ppvVar1;
  EVevent_list pbVar2;
  void *__dest;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  if (list == (EVevent_list)0x0) {
    iVar5 = 1;
  }
  else {
    ppvVar1 = &list->buffer;
    iVar5 = 0;
    do {
      if (*ppvVar1 == (void *)0x0) break;
      iVar5 = iVar5 + 1;
      ppvVar1 = ppvVar1 + 2;
    } while (list != (EVevent_list)0x0);
    iVar5 = iVar5 + 1;
  }
  pbVar2 = (EVevent_list)INT_CMmalloc((long)iVar5 << 4);
  if (iVar5 < 2) {
    uVar3 = 0;
  }
  else {
    lVar4 = 8;
    uVar3 = 0;
    do {
      *(undefined8 *)((long)pbVar2 + lVar4 + -8) = *(undefined8 *)((long)list + lVar4 + -8);
      __dest = INT_CMmalloc(*(size_t *)((long)list + lVar4 + -8));
      *(void **)((long)&pbVar2->length + lVar4) = __dest;
      memcpy(__dest,*(void **)((long)&list->length + lVar4),*(size_t *)((long)list + lVar4 + -8));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (iVar5 - 1 != uVar3);
  }
  pbVar2[uVar3].length = 0;
  pbVar2[uVar3].buffer = (void *)0x0;
  return pbVar2;
}

Assistant:

EVevent_list
copy_EVevent_list(EVevent_list list)
{
    EVevent_list ret;
    int i, size = count_EVevent_list(list);
    ret = (EVevent_list) malloc(sizeof(ret[0]) * size);
    for (i=0; i < size-1; i++) {
        ret[i].length = list[i].length;
        ret[i].buffer = malloc(list[i].length);
        memcpy(ret[i].buffer, list[i].buffer, list[i].length);
    }
    ret[i].length = 0;
    ret[i].buffer = NULL;
    return ret;
}